

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_group.c
# Opt level: O0

UnshieldFileGroup * unshield_file_group_new(Header *header,uint32_t offset)

{
  uint32_t uVar1;
  UnshieldFileGroup *pUVar2;
  uint8_t *puVar3;
  char *pcVar4;
  Header *header_00;
  uint8_t *p;
  UnshieldFileGroup *self;
  uint32_t offset_local;
  Header *header_local;
  
  pUVar2 = (UnshieldFileGroup *)calloc(1,0x10);
  puVar3 = unshield_header_get_buffer(header,offset);
  _unshield_log(3,"unshield_file_group_new",0xe,"File group descriptor offset: %08x",(ulong)offset);
  header_00 = header;
  uVar1 = get_unaligned_le32(puVar3);
  pcVar4 = unshield_header_get_string(header_00,uVar1);
  pUVar2->name = pcVar4;
  if (header->major_version < 6) {
    puVar3 = puVar3 + 0x4c;
  }
  else {
    puVar3 = puVar3 + 0x16;
  }
  uVar1 = get_unaligned_le32(puVar3);
  pUVar2->first_file = uVar1;
  puVar3 = puVar3 + 4;
  uVar1 = get_unaligned_le32(puVar3);
  pUVar2->last_file = uVar1;
  _unshield_log(3,"unshield_file_group_new",0x1d,"File group %08x first file = %i, last file = %i",
                (ulong)offset,(ulong)pUVar2->first_file,pUVar2->last_file,header_00,puVar3 + 4);
  return pUVar2;
}

Assistant:

UnshieldFileGroup* unshield_file_group_new(Header* header, uint32_t offset)/*{{{*/
{
  UnshieldFileGroup* self = NEW1(UnshieldFileGroup);
  uint8_t* p = unshield_header_get_buffer(header, offset);

#if VERBOSE
  unshield_trace("File group descriptor offset: %08x", offset);
#endif

  self->name = unshield_header_get_string(header, READ_UINT32(p)); p += 4;

  if (header->major_version <= 5)
    p += 0x48;
  else
    p += 0x12;

  self->first_file = READ_UINT32(p); p += 4;
  self->last_file  = READ_UINT32(p); p += 4;

#if VERBOSE
  unshield_trace("File group %08x first file = %i, last file = %i", 
      offset, self->first_file, self->last_file);
#endif

  return self;
}